

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall BS::thread_pool::worker(thread_pool *this)

{
  bool bVar1;
  reference __x;
  undefined1 local_40 [8];
  unique_lock<std::mutex> tasks_lock;
  function<void_()> task;
  thread_pool *this_local;
  
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->running), bVar1) {
    std::function<void_()>::function((function<void_()> *)&tasks_lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,&this->tasks_mutex);
    std::condition_variable::wait<BS::thread_pool::worker()::_lambda()_1_>
              (&this->task_available_cv,(unique_lock<std::mutex> *)local_40,
               (anon_class_8_1_8991fb9c)this);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->running);
    if ((bVar1) && (bVar1 = std::atomic::operator_cast_to_bool((atomic *)this), !bVar1)) {
      __x = std::
            queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            ::front(&this->tasks);
      std::function<void_()>::operator=((function<void_()> *)&tasks_lock._M_owns,__x);
      std::
      queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
      ::pop(&this->tasks);
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
      std::function<void_()>::operator()((function<void_()> *)&tasks_lock._M_owns);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
      std::__atomic_base<unsigned_long>::operator--
                (&(this->tasks_total).super___atomic_base<unsigned_long>);
      bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->waiting);
      if (bVar1) {
        std::condition_variable::notify_one();
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    std::function<void_()>::~function((function<void_()> *)&tasks_lock._M_owns);
  }
  return;
}

Assistant:

void worker()
    {
        while (running)
        {
            std::function<void()> task;
            std::unique_lock<std::mutex> tasks_lock(tasks_mutex);
            task_available_cv.wait(tasks_lock, [this] { return !tasks.empty() || !running; });
            if (running && !paused)
            {
                task = std::move(tasks.front());
                tasks.pop();
                tasks_lock.unlock();
                task();
                tasks_lock.lock();
                --tasks_total;
                if (waiting)
                    task_done_cv.notify_one();
            }
        }
    }